

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  XmlWriter *this_00;
  string local_68;
  string local_48;
  allocator<char> local_22;
  allocator<char> local_21;
  
  LazyStat<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase).currentGroupInfo,groupInfo);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Group",&local_22);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"name",&local_21);
  XmlWriter::writeAttribute(this_00,&local_48,&groupInfo->name);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testGroupStarting( groupInfo );
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupInfo.name );
        }